

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiments.cpp
# Opt level: O0

void FWHT(fwht_t *data,uint bits)

{
  ffe_t fVar1;
  ffe_t fVar2;
  uint uVar3;
  ffe_t *pfVar4;
  ffe_t *pfVar5;
  byte in_SIL;
  long in_RDI;
  uint j;
  uint i;
  uint width;
  uint size;
  fwht_t dif;
  fwht_t sum;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  
  uVar3 = (uint)(1L << (in_SIL & 0x3f));
  for (local_2c = 1; local_2c < uVar3; local_2c = local_2c << 1) {
    for (local_30 = 0; local_30 < uVar3; local_30 = local_2c * 2 + local_30) {
      for (local_34 = local_30; local_34 < local_2c + local_30; local_34 = local_34 + 1) {
        pfVar5 = (ffe_t *)(in_RDI + (ulong)local_34 * 2);
        pfVar4 = (ffe_t *)(in_RDI + (ulong)(local_34 + local_2c) * 2);
        fVar1 = AddModQ(*pfVar5,*pfVar4);
        fVar2 = SubModQ(*pfVar5,*pfVar4);
        *pfVar5 = fVar1;
        *pfVar4 = fVar2;
      }
    }
  }
  return;
}

Assistant:

static void FWHT(fwht_t* data, const unsigned bits)
{
    const unsigned size = (unsigned)(1UL << bits);
    for (unsigned width = 1; width < size; width <<= 1)
        for (unsigned i = 0; i < size; i += (width << 1))
            for (unsigned j = i; j < (width + i); ++j)
                FWHT_2(data[j], data[j + width]);
}